

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteTailCallAsserts(CWriter *this,FuncSignature *sig)

{
  bool bVar1;
  char (*in_RCX) [6];
  vector<wabt::Type,_std::allocator<wabt::Type>_> *in_RDX;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *u;
  Newline *unaff_RBX;
  uint *in_R8;
  char (*in_R9) [3];
  Newline *in_stack_00000008;
  
  if ((sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [22])sig,in_RDX,in_RCX,in_R8,in_R9,unaff_RBX);
  }
  if ((sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar1 = std::operator!=(&sig->result_types,&sig->param_types);
    if (bVar1) {
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [22])&sig->result_types,u,in_RCX,in_R8,in_R9,
                 in_stack_00000008);
      return;
    }
  }
  return;
}

Assistant:

void CWriter::WriteTailCallAsserts(const FuncSignature& sig) {
  if (sig.param_types.size()) {
    Write("static_assert(sizeof(", sig.param_types, ") <= ", kTailCallStackSize,
          ");", Newline());
  }
  if (sig.result_types.size() && sig.result_types != sig.param_types) {
    Write("static_assert(sizeof(", sig.result_types,
          ") <= ", kTailCallStackSize, ");", Newline());
  }
}